

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O3

GCstr * lj_str_new(lua_State *L,char *str,size_t lenx)

{
  long lVar1;
  ulong uVar2;
  uint *puVar3;
  uint32_t uVar4;
  uint uVar5;
  GCstr *pGVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint *puVar20;
  uint32_t uVar21;
  GCstr *sx;
  uint32_t len;
  bool bVar22;
  byte local_60;
  
  if (0x7ffffeff < lenx) {
    lj_err_msg(L,LJ_ERR_STROV);
  }
  plVar13 = (long *)(ulong)(L->glref).ptr32;
  len = (uint32_t)lenx;
  if (len == 0) {
    return (GCstr *)(plVar13 + 0x1f);
  }
  uVar4 = lua_hash(str,len);
  lVar1 = *plVar13;
  uVar15 = *(uint *)(plVar13 + 1);
  pGVar6 = (GCstr *)(ulong)*(uint *)(lVar1 + (ulong)(uVar15 & uVar4) * 4);
  uVar5 = (len + (int)str) - 1 & 0xfff;
  if (uVar5 < 0xffd) {
    if (pGVar6 == (GCstr *)0x0) {
LAB_00112eaa:
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      do {
        if ((pGVar6->hash == uVar4) && (pGVar6->len == len)) {
          uVar12 = uVar12 + ((uint)(lenx >> 4) & 0xfffffff) + 1;
          uVar17 = 0;
          iVar8 = len * -8;
          while( true ) {
            iVar8 = iVar8 + 0x20;
            uVar9 = *(uint *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)uVar17);
            if (*(uint *)(str + uVar17) != uVar9) break;
            uVar17 = uVar17 + 4;
            if (len <= uVar17) goto LAB_00113159;
          }
          if ((-4 < (int)(uVar17 - len)) &&
             ((uVar9 ^ *(uint *)(str + uVar17)) << ((byte)iVar8 & 0x1f) == 0)) goto LAB_00113159;
        }
        pGVar6 = (GCstr *)(ulong)(pGVar6->nextgc).gcptr32;
        uVar12 = uVar12 + 1;
      } while (pGVar6 != (GCstr *)0x0);
    }
  }
  else {
    if (pGVar6 == (GCstr *)0x0) goto LAB_00112eaa;
    uVar12 = 0;
    do {
      if ((pGVar6->hash == uVar4) && (pGVar6->len == len)) {
        iVar8 = bcmp(str,pGVar6 + 1,lenx);
        if (iVar8 == 0) goto LAB_00113159;
        uVar12 = uVar12 + ((uint)(lenx >> 4) & 0xfffffff) + 1;
      }
      pGVar6 = (GCstr *)(ulong)(pGVar6->nextgc).gcptr32;
      uVar12 = uVar12 + 1;
    } while (pGVar6 != (GCstr *)0x0);
  }
  if (0xc < len) {
    uVar2 = plVar13[2];
    uVar16 = 1L << (byte)(uVar4 >> 0x1a);
    if ((uVar2 >> (uVar4 >> 0x1a) & 1) == 0) {
      bVar22 = false;
    }
    else {
      bVar22 = ((ulong)plVar13[3] >> ((ulong)(uVar4 >> 0x14) & 0x3f) & 1) != 0;
    }
    uVar17 = 0;
    if ((bVar22) || (0x28 < uVar12)) {
      uVar10 = 0xcafedead;
      uVar9 = 0xdeadbeef;
      uVar14 = 0;
      lVar19 = (ulong)(len - 8) + 8;
      puVar3 = (uint *)str;
      do {
        puVar20 = puVar3;
        lVar18 = lVar19;
        uVar14 = uVar14 ^ *puVar20;
        uVar17 = uVar17 ^ puVar20[1];
        uVar10 = uVar10 + uVar14;
        iVar8 = uVar9 + uVar17;
        uVar17 = (uVar17 << 7 | uVar17 >> 0x19) - uVar10;
        uVar14 = (uVar14 << 5 | uVar14 >> 0x1b) - iVar8;
        uVar10 = (uVar10 * 0x1000000 | uVar10 >> 8) ^ uVar14;
        uVar9 = (iVar8 * 2 | (uint)(iVar8 < 0)) ^ uVar17;
        lVar19 = lVar18 + -8;
        puVar3 = puVar20 + 2;
      } while (8 < (uint)lVar19);
      uVar14 = uVar14 ^ *(uint *)((long)puVar20 + lVar19);
      uVar17 = uVar17 ^ *(uint *)((long)puVar20 + lVar18 + -4);
      uVar11 = (uVar10 + uVar17) - (uVar14 << 9 | uVar14 >> 0x17);
      uVar9 = (uVar9 + uVar14) - (uVar17 << 0x12 | uVar17 >> 0xe);
      uVar10 = (uVar9 ^ uVar11) - (uVar11 * 0x2000000 | uVar11 >> 7);
      uVar9 = ((uVar9 * 0x2000 | uVar9 >> 0x13) +
               (len - ((uVar17 ^ uVar14) << 7 | (uVar17 ^ uVar14) >> 0x19)) + uVar11 ^ uVar10) -
              (uVar10 * 0x10000 | uVar10 >> 0x10);
      uVar17 = (uVar11 ^ uVar9) - (uVar9 * 0x10 | uVar9 >> 0x1c);
      uVar17 = (uVar10 ^ uVar17) - (uVar17 * 0x4000 | uVar17 >> 0x12);
      uVar21 = uVar4 & 0xfc000000 | (uVar9 ^ uVar17) - (uVar17 * 0x1000000 | uVar17 >> 8) >> 6;
      if (bVar22) {
        pGVar6 = (GCstr *)(ulong)*(uint *)(lVar1 + (ulong)(uVar15 & uVar21) * 4);
        if (uVar5 < 0xffd) {
          if (pGVar6 != (GCstr *)0x0) {
            do {
              if ((pGVar6->hash == uVar21) && (pGVar6->len == len)) {
                uVar15 = 0;
                iVar8 = len * -8;
                while( true ) {
                  iVar8 = iVar8 + 0x20;
                  uVar5 = *(uint *)((long)&pGVar6[1].nextgc.gcptr32 + (ulong)uVar15);
                  if (*(uint *)(str + uVar15) != uVar5) break;
                  uVar15 = uVar15 + 4;
                  if (len <= uVar15) goto LAB_00113159;
                }
                if ((-4 < (int)(uVar15 - len)) &&
                   ((uVar5 ^ *(uint *)(str + uVar15)) << ((byte)iVar8 & 0x1f) == 0)) {
LAB_00113159:
                  if ((~*(byte *)(plVar13 + 0xb) & pGVar6->marked & 3) != 0) {
                    pGVar6->marked = pGVar6->marked ^ 3;
                  }
                  plVar13[6] = plVar13[6] + 1;
                  return pGVar6;
                }
              }
              pGVar6 = (GCstr *)(ulong)(pGVar6->nextgc).gcptr32;
            } while (pGVar6 != (GCstr *)0x0);
          }
        }
        else {
          for (; pGVar6 != (GCstr *)0x0; pGVar6 = (GCstr *)(ulong)(pGVar6->nextgc).gcptr32) {
            if (((pGVar6->hash == uVar21) && (pGVar6->len == len)) &&
               (iVar8 = bcmp(str,pGVar6 + 1,lenx), iVar8 == 0)) goto LAB_00113159;
          }
        }
      }
      if (0x28 < uVar12) {
        local_60 = (byte)(uVar4 >> 0x14);
        uVar7 = 1L << (local_60 & 0x3f);
        plVar13[2] = uVar2 | uVar16;
        plVar13[3] = plVar13[3] | uVar7;
        local_60 = local_60 | 0xc0;
        plVar13[4] = plVar13[4] | uVar16;
        plVar13[5] = plVar13[5] | uVar7;
        goto LAB_00112efb;
      }
    }
  }
  local_60 = 0;
  uVar21 = uVar4;
LAB_00112efb:
  plVar13[7] = plVar13[7] + 1;
  pGVar6 = (GCstr *)lj_mem_realloc(L,(void *)0x0,0,len + 0x11);
  pGVar6->marked = *(byte *)(plVar13 + 0xb) & 3;
  pGVar6->gct = '\x04';
  pGVar6->reserved = '\0';
  pGVar6->len = len;
  pGVar6->hash = uVar21;
  pGVar6->strflags = local_60;
  memcpy(pGVar6 + 1,str,lenx);
  *(undefined1 *)((long)&pGVar6[1].nextgc.gcptr32 + lenx) = 0;
  uVar15 = *(uint *)(plVar13 + 1);
  lVar1 = *plVar13;
  (pGVar6->nextgc).gcptr32 = *(uint32_t *)(lVar1 + (ulong)(uVar21 & uVar15) * 4);
  *(int *)(lVar1 + (ulong)(uVar21 & uVar15) * 4) = (int)pGVar6;
  uVar15 = *(uint *)((long)plVar13 + 0xc);
  *(uint *)((long)plVar13 + 0xc) = uVar15 + 1;
  if (*(uint *)(plVar13 + 1) < uVar15) {
    lj_str_resize(L,*(uint *)(plVar13 + 1) * 2 + 1);
  }
  return pGVar6;
}

Assistant:

GCstr *lj_str_new(lua_State *L, const char *str, size_t lenx)
{
  global_State *g;
  GCstr *s;
  GCobj *o;
  MSize len = (MSize)lenx;
  uint8_t strflags = 0;
#if LUAJIT_SMART_STRINGS
  unsigned collisions = 0;
#endif
  if (lenx >= LJ_MAX_STR)
    lj_err_msg(L, LJ_ERR_STROV);
  g = G(L);
  if (len == 0)
    return &g->strempty;
  /* Compute string hash. Constants taken from lookup3 hash by Bob Jenkins. */
  MSize h = lua_hash(str, len);
  /* Check if the string has already been interned. */
  o = gcref(g->strhash[h & g->strmask]);
#if LUAJIT_SMART_STRINGS
/*
** The default "fast" string hash function samples only a few positions
** in a string, the remaining bytes don't affect the function's result.
** The function performs well for short strings; however long strings
** can yield extremely high collision rates.
**
** An adaptive schema was implemented. Two hash functions are used
** simultaneously. A bucket is picked based on the output of the fast
** hash function. If an item is to be inserted in a collision chain
** longer than a certain threshold, another bucket is picked based on
** the stronger hash function. Since two hash functions are used
** simultaneously, insert should consider two buckets. The second bucket
** is often NOT considered thanks to the bloom filter. The filter is
** rebuilt during GC cycle.
**
** Parameters below were tuned on a set of benchmarks. Max_collisions is
** also backed by theory: the expected maximum length of a collision
** chain in a hash table with the fill factor of 1.0 is
** O(log(N)/log(log(N))), assuming uniformly distributed random keys.
** The upper bound for N=65,000 is 10, hence 40 is a clear indication of
** an anomaly.
**/
#define max_collisions 40
#define inc_collision_soft() (collisions++)
/* If different strings yield the same hash sum, grow counter faster. */
#define inc_collision_hard() (collisions+=1+(len>>4), 1)
#else
#define inc_collision_hard() (1)
#define inc_collision_soft()
#endif
  if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      str_fastcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  } else {  /* Slow path: end of string is too close to a page boundary. */
    while (o != NULL) {
      GCstr *sx = gco2str(o);
      if (sx->hash == h && sx->len == len && inc_collision_hard() &&
                      memcmp(str, strdata(sx), len) == 0) {
	/* Resurrect if dead. Can only happen with fixstring() (keywords). */
	if (isdead(g, o)) flipwhite(o);
	g->strhash_hit++;
	return sx;  /* Return existing string. */
      }
      o = gcnext(o);
      inc_collision_soft();
    }
  }
#if LUAJIT_SMART_STRINGS
  /* "Fast" hash function consumes all bytes of a string <= 12 bytes. */
  if (len > 12) {
    /*
    ** The bloom filter is keyed with the high 12 bits of the fast
    ** hash sum. The filter is rebuilt during GC cycle. It's beneficial
    ** to have these bits readily available and avoid hash sum
    ** recalculation during GC. High 6 bits are included in the "full"
    ** hash sum, and bits 19-25 are stored in s->strflags.
    **/
    int search_fullh =
       bloomtest(g->strbloom.cur[0], h>>(sizeof(h)*8- 6)) != 0 &&
       bloomtest(g->strbloom.cur[1], h>>(sizeof(h)*8-12)) != 0;
    if (LJ_UNLIKELY(search_fullh || collisions > max_collisions)) {
      MSize fh = lj_fullhash((const uint8_t*)str, len);
#define high6mask ((~(MSize)0)<<(sizeof(MSize)*8-6))
      fh = (fh >> 6) | (h & high6mask);
      if (search_fullh) {
	/* Recheck if the string has already been interned with "harder" hash. */
	o = gcref(g->strhash[fh & g->strmask]);
	if (LJ_LIKELY((((uintptr_t)str+len-1) & (LJ_PAGESIZE-1)) <= LJ_PAGESIZE-4)) {
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && str_fastcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	} else {  /* Slow path: end of string is too close to a page boundary. */
	  while (o != NULL) {
	    GCstr *sx = gco2str(o);
	    if (sx->hash == fh && sx->len == len && memcmp(str, strdata(sx), len) == 0) {
	      /* Resurrect if dead. Can only happen with fixstring() (keywords). */
	      if (isdead(g, o)) flipwhite(o);
	      g->strhash_hit++;
	      return sx;  /* Return existing string. */
	    }
	    o = gcnext(o);
	  }
	}
      }
      if (collisions > max_collisions) {
	strflags = 0xc0 | ((h>>(sizeof(h)*8-12))&0x3f);
	bloomset(g->strbloom.cur[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.cur[1], h>>(sizeof(h)*8-12));
	bloomset(g->strbloom.next[0], h>>(sizeof(h)*8- 6));
	bloomset(g->strbloom.next[1], h>>(sizeof(h)*8-12));
	h = fh;
      }
    }
  }
#endif
  g->strhash_miss++;
  /* Nope, create a new string. */
  s = lj_mem_newt(L, sizeof(GCstr)+len+1, GCstr);
  newwhite(g, s);
  s->gct = ~LJ_TSTR;
  s->len = len;
  s->hash = h;
  s->reserved = 0;
  s->strflags = strflags;
  memcpy(strdatawr(s), str, len);
  strdatawr(s)[len] = '\0';  /* Zero-terminate string. */
  /* Add it to string hash table. */
  h &= g->strmask;
  s->nextgc = g->strhash[h];
  /* NOBARRIER: The string table is a GC root. */
  setgcref(g->strhash[h], obj2gco(s));
  if (g->strnum++ > g->strmask)  /* Allow a 100% load factor. */
    lj_str_resize(L, (g->strmask<<1)+1);  /* Grow string table. */
  return s;  /* Return newly interned string. */
}